

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O3

void Interactor_Input_Event_Notify(Am_Object *event_window,Am_Input_Event *ev)

{
  short *psVar1;
  undefined4 value;
  Deferred_Event_Holder *pDVar2;
  undefined4 value_00;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  Am_Inter_State AVar11;
  Am_Value *pAVar12;
  bool *pbVar13;
  ostream *poVar14;
  Am_Wrapper *pAVar15;
  Am_Priority_List *this;
  ushort uVar16;
  uint uVar17;
  uint uVar18;
  Am_Object *pAVar19;
  Deferred_Event_Holder *this_00;
  Am_Object obj_1;
  Am_Object owner_1;
  bool abort;
  bool start;
  float local_13c;
  float this_priority;
  Am_Input_Char deferring;
  Am_Value run_also_value;
  Am_Object local_120;
  Am_Object local_118;
  Am_Object head;
  int local_100;
  int iStack_fc;
  Am_Value local_f0;
  Am_Object local_e0;
  Am_Object inter_1;
  Am_Object owner;
  anon_union_8_8_ea4c8939_for_value local_b0;
  Am_Value_List run_also_list;
  Am_Value inter_list_value;
  Am_Object run_also_object;
  Am_Object inter;
  Am_Object local_68;
  Am_Value *local_60;
  ulong local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  bVar6 = Am_Value_List::Empty(&Am_Modal_Windows);
  if (!bVar6) {
    head.data = (Am_Object_Data *)0x0;
    Am_Value_List::Start(&Am_Modal_Windows);
    pAVar12 = Am_Value_List::Get(&Am_Modal_Windows);
    Am_Object::operator=(&head,pAVar12);
    bVar6 = Am_Object::operator==(&head,event_window);
    if (!bVar6) {
      Am_Object::Get_Object(&owner,(Am_Slot_Key)event_window,10);
      while (bVar6 = Am_Object::Valid(&owner), bVar6) {
        Am_Object::Am_Object(&inter_1,&Am_Screen);
        bVar6 = Am_Object::Is_Instance_Of(&owner,&inter_1);
        Am_Object::~Am_Object(&inter_1);
        if (bVar6) break;
        bVar6 = Am_Object::operator==(&owner,&head);
        if (bVar6) {
          Am_Object::~Am_Object(&owner);
          goto LAB_001b056d;
        }
        Am_Object::Get_Object((Am_Object *)&inter_list_value,(Am_Slot_Key)&owner,10);
        Am_Object::operator=(&owner,(Am_Object *)&inter_list_value);
        Am_Object::~Am_Object((Am_Object *)&inter_list_value);
      }
      uVar16 = *(ushort *)&(ev->input_char).field_0x2;
      if ((uVar16 & 0xf0) == 0x10 || (uVar16 & 0xf00) == 0) {
        Am_Object::Am_Object((Am_Object *)&run_also_value,&Am_No_Object);
        Am_Beep((Am_Object *)&run_also_value);
        Am_Object::~Am_Object((Am_Object *)&run_also_value);
      }
      Am_Object::~Am_Object(&owner);
      Am_Object::~Am_Object(&head);
      return;
    }
LAB_001b056d:
    Am_Object::~Am_Object(&head);
  }
  if (Am_List_Of_Deferred_Events != (Deferred_Event_Holder *)0x0) {
    local_e0.data = (Am_Object_Data *)0x0;
    bVar6 = false;
    this_00 = Am_List_Of_Deferred_Events;
    do {
      pDVar2 = this_00->next;
      start = false;
      abort = false;
      uVar16 = *(ushort *)&(ev->input_char).field_0x2;
      pbVar13 = &abort;
      if ((uVar16 & 0xf00) == 0 || (uVar16 & 0xf0) == 0x10) goto LAB_001b0678;
      bVar7 = Am_Object::operator!=(&this_00->event_window,event_window);
      if (bVar7) {
LAB_001b065a:
        uVar16 = *(ushort *)&(this_00->want_ic).field_0x2 >> 4 & 0xf;
        pbVar13 = &start;
        if (uVar16 == 5) goto LAB_001b0678;
        if (uVar16 == 4) {
          pbVar13 = &abort;
          goto LAB_001b0678;
        }
      }
      else {
        iVar10 = this_00->x - ev->x;
        iVar3 = -iVar10;
        if (0 < iVar10) {
          iVar3 = iVar10;
        }
        if (Am_Minimum_Move_For_Drag <= iVar3) goto LAB_001b065a;
        uVar17 = this_00->y - ev->y;
        uVar18 = -uVar17;
        if (0 < (int)uVar17) {
          uVar18 = uVar17;
        }
        if ((uint)Am_Minimum_Move_For_Drag <= uVar18) goto LAB_001b065a;
        if ((*(ushort *)&(ev->input_char).field_0x2 & 0xf0) != 0x20) goto LAB_001b067b;
        uVar16 = *(ushort *)&(this_00->want_ic).field_0x2 >> 4 & 0xf;
        pbVar13 = &abort;
        if (uVar16 != 5) {
          if (uVar16 != 4) goto LAB_001b067b;
          pbVar13 = &start;
        }
LAB_001b0678:
        *pbVar13 = true;
      }
LAB_001b067b:
      if (start == true) {
        Am_Object::Am_Object(&inter_1,&this_00->inter);
        Am_Object::Am_Object((Am_Object *)&inter_list_value,&inter_1);
        if (am_trace_next_inter == true) {
          am_trace_next_inter = false;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\n>> ** Interactor ",0x12);
          poVar14 = operator<<((ostream *)&std::cout,(Am_Object *)&inter_list_value);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14," started.  Starting tracing\n",0x1c);
          std::ostream::flush();
          Am_Object::Am_Object(&head,(Am_Object *)&inter_list_value);
          Am_Set_Inter_Trace(&head);
          Am_Object::~Am_Object(&head);
        }
        Am_Object::~Am_Object((Am_Object *)&inter_list_value);
        Am_Object::Am_Object((Am_Object *)&run_also_value,&this_00->event_window);
        Am_Object::Am_Object((Am_Object *)&run_also_list,&this_00->obj);
        Am_Input_Char::Am_Input_Char
                  ((Am_Input_Char *)&head,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
        local_f0.type = 0;
        local_f0.value.wrapper_value = (Am_Wrapper *)0x0;
        value = this_00->x;
        value_00 = this_00->y;
        head.data._2_2_ = *(ushort *)&(this_00->got_ic).field_0x2 & 0xfff | head.data._2_2_ & 0xf000
        ;
        head.data._0_2_ = (this_00->got_ic).code;
        Am_Object::Am_Object(&owner_1,(Am_Object *)&run_also_value);
        Get_a_drawonable(&owner_1);
        Am_Object::~Am_Object(&owner_1);
        Am_List_Of_Deferred_Events = this_00->next;
        Am_Object::~Am_Object(&this_00->obj);
        Am_Object::~Am_Object(&this_00->event_window);
        Am_Object::~Am_Object(&this_00->inter);
        operator_delete(this_00);
        pAVar15 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&run_also_value);
        Am_Object::Set(&inter_1,0x68,pAVar15,0);
        pAVar15 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&run_also_list);
        Am_Object::Set(&inter_1,0x11a,pAVar15,0);
        pAVar15 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&run_also_list);
        Am_Object::Set(&inter_1,0x119,pAVar15,0);
        Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&head);
        Am_Object::Set(&inter_1,0x11b,(Am_Value *)&owner,0);
        Am_Value::~Am_Value((Am_Value *)&owner);
        Am_Object::Set(&inter_1,0x11f,value,0);
        Am_Object::Set(&inter_1,0x120,value_00,0);
        Am_Object::Set(&inter_1,0x121,value,0);
        Am_Object::Set(&inter_1,0x122,value_00,0);
        pAVar12 = Am_Object::Get(&inter_1,0xbe,0);
        Am_Inter_Internal_Method::Am_Inter_Internal_Method
                  ((Am_Inter_Internal_Method *)&owner,pAVar12);
        (*local_b0.proc_value)(&inter_1,&run_also_list,&run_also_value);
        bVar6 = Am_Object::Valid((Am_Object *)&run_also_value);
        if (bVar6) {
          Am_Object::Am_Object(&local_118,(Am_Object *)&run_also_value);
          set_want_move_one_win(&local_118,false);
          Am_Object::~Am_Object(&local_118);
        }
        Am_Value::~Am_Value(&local_f0);
        Am_Object::~Am_Object((Am_Object *)&run_also_list);
        Am_Object::~Am_Object((Am_Object *)&run_also_value);
        Am_Object::~Am_Object(&inter_1);
LAB_001b09ef:
        bVar6 = true;
      }
      else if (abort == true) {
        Am_Object::Am_Object(&head,&this_00->event_window);
        set_want_move_one_win(&head,false);
        Am_Object::~Am_Object(&head);
        Am_List_Of_Deferred_Events = this_00->next;
        Am_Object::~Am_Object(&this_00->obj);
        Am_Object::~Am_Object(&this_00->event_window);
        Am_Object::~Am_Object(&this_00->inter);
        operator_delete(this_00);
        goto LAB_001b09ef;
      }
      this_00 = pDVar2;
    } while (pDVar2 != (Deferred_Event_Holder *)0x0);
    Am_Object::~Am_Object(&local_e0);
    if (bVar6) {
      return;
    }
  }
  pAVar12 = Am_Object::Get(event_window,0x124,1);
  Am_Value::Am_Value(&inter_list_value,pAVar12);
  bVar6 = Am_Value::Valid(&inter_list_value);
  if (bVar6) {
    this = (Am_Priority_List *)Am_Value::operator_cast_to_void_(&inter_list_value);
  }
  else {
    this = (Am_Priority_List *)0x0;
  }
  inter.data = (Am_Object_Data *)0x0;
  run_also_value.type = 0;
  run_also_value.value.wrapper_value = (Am_Wrapper *)0x0;
  run_also_object.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&run_also_list);
  if (this != (Am_Priority_List *)0x0) {
    this->refs = this->refs + 1;
    Am_Priority_List::Start(this);
  }
  Am_Priority_List::Start(all_wins_inter_list);
  local_60 = &ev->user_id;
  local_13c = 0.0;
  bVar7 = false;
  local_58 = 0;
  bVar9 = false;
  bVar6 = false;
LAB_001b0af2:
  do {
    bVar5 = bVar6;
    bVar4 = bVar9;
    bVar6 = Am_Priority_List::Two_List_Get_Next(all_wins_inter_list,this,&inter,&this_priority);
    if (!bVar6) {
LAB_001b17a6:
      if (this != (Am_Priority_List *)0x0) {
        psVar1 = &this->refs;
        *psVar1 = *psVar1 + -1;
        if (*psVar1 == 0) {
          operator_delete(this);
        }
      }
      Am_Value_List::~Am_Value_List(&run_also_list);
      Am_Object::~Am_Object(&run_also_object);
      Am_Value::~Am_Value(&run_also_value);
      Am_Object::~Am_Object(&inter);
      Am_Value::~Am_Value(&inter_list_value);
      return;
    }
    bVar8 = Am_Object::Valid(&inter);
    bVar9 = bVar4;
    bVar6 = bVar5;
  } while (!bVar8);
  if (((bVar4) && (!bVar7)) && (this_priority < local_13c)) goto LAB_001b17a6;
  if (bVar5) {
    Am_Value_List::Start(&run_also_list);
  }
  if (bVar4) {
    if (bVar7) {
      if (((local_58 & 1) != 0) && (bVar6 = Am_Object::operator==(&inter,&run_also_object), bVar6))
      goto LAB_001b0bcf;
      bVar9 = true;
      bVar6 = false;
      if (!bVar5) goto LAB_001b0af2;
      pAVar15 = Am_Object::operator_cast_to_Am_Wrapper_(&inter);
      bVar8 = Am_Value_List::Member(&run_also_list,pAVar15);
      bVar6 = true;
    }
    else {
      pAVar12 = Am_Object::Get(&inter,0x11c,0);
      bVar8 = Am_Value::Valid(pAVar12);
    }
    bVar9 = true;
    if (bVar8 == false) goto LAB_001b0af2;
  }
LAB_001b0bcf:
  Am_Object::Set(&Am_Screen,499,local_60,0);
  pAVar12 = Am_Object::Get(&inter,0x1f1,1);
  bVar6 = Am_Value::operator==(pAVar12,-2);
  if (bVar6) {
    pAVar12 = Am_Object::Get(&inter,0x1f2,1);
    bVar6 = Am_Value::Valid(pAVar12);
    if ((bVar6) && (bVar6 = Am_Value::operator==(pAVar12,local_60), !bVar6)) {
      bVar8 = Am_Value::operator==(pAVar12,-2);
LAB_001b0c75:
      bVar9 = bVar4;
      bVar6 = bVar5;
      if (bVar8 == false) goto LAB_001b0af2;
    }
  }
  else {
    bVar6 = Am_Value::operator==(pAVar12,-1);
    if (!bVar6) {
      bVar8 = Am_Value::operator==(pAVar12,local_60);
      goto LAB_001b0c75;
    }
  }
  inter_1.data = (Am_Object_Data *)0x0;
  Am_Object::Am_Object(&local_38,&inter);
  AVar11 = Am_Get_Inter_State(&local_38);
  Am_Object::~Am_Object(&local_38);
  pAVar12 = Am_Object::Get(&inter,0xcc,0);
  bVar6 = Am_Value::operator_cast_to_bool(pAVar12);
  deferring = Am_No_Input_Char;
  obj_1.data = (Am_Object_Data *)0x0;
  if (bVar6) {
    if (AVar11 - Am_INTER_RUNNING < 2) {
      pAVar15 = Am_Object::operator_cast_to_Am_Wrapper_(event_window);
      Am_Object::Set(&inter,0x68,pAVar15,0);
      Am_Object::Set(&inter,0x121,ev->x,0);
      Am_Object::Set(&inter,0x122,ev->y,0);
      Am_Object::Am_Object(&local_68,&inter);
      if (am_trace_next_inter == true) {
        am_trace_next_inter = false;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\n>> ** Interactor ",0x12);
        poVar14 = operator<<((ostream *)&std::cout,&local_68);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14," started.  Starting tracing\n",0x1c);
        std::ostream::flush();
        Am_Object::Am_Object(&head,&local_68);
        Am_Set_Inter_Trace(&head);
        Am_Object::~Am_Object(&head);
      }
      Am_Object::~Am_Object(&local_68);
      bVar6 = check_event(&inter,event_window,ev->input_char,0xbc,&deferring);
      if (bVar6) {
        pAVar12 = Am_Object::Get(&inter,0xd3,0);
        bVar6 = Am_Value::operator_cast_to_bool(pAVar12);
        if (bVar6) {
          Am_Object::Am_Object(&local_50,&Am_No_Object);
          Am_Beep(&local_50);
          Am_Object::~Am_Object(&local_50);
        }
        pAVar12 = Am_Object::Get(&inter,0xc4,0);
        Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar12);
        pAVar19 = &Am_No_Object;
LAB_001b1056:
        (*(code *)0x0)(&inter,pAVar19,event_window,ev);
      }
      else {
        local_120.data = (Am_Object_Data *)0x0;
        head.data = head.data & 0xffffffffffff0000;
        pAVar12 = Am_Object::Get(&inter,0xbb,1);
        Am_Value::operator=((Am_Value *)&head,pAVar12);
        if (((Am_Value_Type)head.data == 4) || ((Am_Value_Type)head.data == 2)) {
          bVar6 = Am_Value::Valid((Am_Value *)&head);
          pAVar19 = event_window;
          if (!bVar6) {
            pAVar19 = &Am_No_Object;
          }
          Am_Object::operator=(&local_120,pAVar19);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"** Amulet Error: Contents of Am_RUNNING_WHERE_TEST slot"
                     ,0x37);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," of inter ",10);
          poVar14 = operator<<((ostream *)&std::cerr,&inter);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14," is not Boolean or Am_Where_Method, type = ",0x2b);
          Am_Print_Type((ostream *)&std::cerr,(Am_Value_Type)head.data);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," Aborting\n",10)
          ;
          Am_Object::operator=(&local_120,&Am_No_Object);
          Am_Error(&inter,0xbb);
        }
        Am_Value::~Am_Value((Am_Value *)&head);
        Am_Object::operator=(&obj_1,&local_120);
        Am_Object::~Am_Object(&local_120);
        bVar6 = check_event(&inter,event_window,ev->input_char,0xbd,&deferring);
        bVar9 = Am_Object::Valid(&obj_1);
        if (bVar9) {
          pAVar15 = Am_Object::operator_cast_to_Am_Wrapper_(&obj_1);
          Am_Object::Set(&inter,0x119,pAVar15,0);
          if (AVar11 == Am_INTER_OUTSIDE) {
            pAVar12 = Am_Object::Get(&inter,0xc1,0);
            Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar12);
            (*(code *)0x0)(&inter,&obj_1,event_window,ev);
          }
          pAVar12 = Am_Object::Get(&inter,(ushort)bVar6 + (ushort)bVar6 * 2 + 0xbf,0);
          Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar12);
          pAVar19 = &obj_1;
        }
        else {
          if (AVar11 == Am_INTER_RUNNING) {
            pAVar12 = Am_Object::Get(&inter,0xc0,0);
            Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar12);
            (*(code *)0x0)(&inter,&Am_No_Object,event_window,ev);
          }
          if (!bVar6) goto LAB_001b1483;
          pAVar12 = Am_Object::Get(&inter,0xc3,0);
          Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar12);
          pAVar19 = &Am_No_Object;
        }
        (*(code *)0x0)(&inter,pAVar19,event_window,ev);
      }
LAB_001b1483:
      Am_Object::~Am_Object(&obj_1);
      bVar6 = Am_Object::Valid(&inter);
      if (bVar6) {
        pAVar12 = Am_Object::Get(&inter,0x11c,1);
        Am_Value::operator=(&run_also_value,pAVar12);
        bVar6 = Am_Value::Valid(&run_also_value);
        if (bVar6) {
          bVar6 = Am_Value_List::Test(&run_also_value);
          if (bVar6) {
            Am_Value_List::operator=(&run_also_list,&run_also_value);
            local_13c = this_priority;
            bVar7 = true;
            bVar9 = true;
            bVar6 = true;
          }
          else {
            bVar9 = bVar4;
            bVar6 = bVar5;
            if (run_also_value.type == 0xa001) {
              pAVar19 = Am_Object::operator=(&run_also_object,&run_also_value);
              local_13c = this_priority;
              bVar7 = true;
              local_58 = CONCAT71((int7)((ulong)pAVar19 >> 8),1);
              bVar9 = true;
            }
          }
          goto LAB_001b0af2;
        }
      }
      local_13c = this_priority;
      bVar9 = true;
      bVar6 = bVar5;
      goto LAB_001b0af2;
    }
    if (AVar11 != Am_INTER_ANIMATING) {
      if (AVar11 != Am_INTER_WAITING) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"** Amulet Error: Illegal state in Interactor ",0x2d);
        poVar14 = operator<<((ostream *)&std::cerr,&inter);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
        Am_Error(&inter,0x123);
        goto LAB_001b1483;
      }
      bVar6 = check_event(&inter,event_window,ev->input_char,0xb9,&deferring);
      if (bVar6) {
        local_120.data = (Am_Object_Data *)0x0;
        head.data = head.data & 0xffffffffffff0000;
        Am_Object::Get_Object(&owner_1,(Am_Slot_Key)&inter,10);
        pAVar12 = Am_Object::Get(&inter,0xba,1);
        Am_Value::operator=((Am_Value *)&head,pAVar12);
        if (((Am_Value_Type)head.data != 4) && ((Am_Value_Type)head.data != 2)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Am_START_WHERE_TEST of ",0x17);
          poVar14 = operator<<((ostream *)&std::cerr,&inter);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14," should be boolean or Am_Where_Method, but is ",0x2e);
          poVar14 = operator<<(poVar14,(Am_Value *)&head);
          std::endl<char,std::char_traits<char>>(poVar14);
          Am_Error();
        }
        bVar6 = Am_Value::Valid((Am_Value *)&head);
        pAVar19 = &owner_1;
        if (!bVar6) {
          pAVar19 = &Am_No_Object;
        }
        Am_Object::operator=(&local_120,pAVar19);
        Am_Object::~Am_Object(&owner_1);
        Am_Value::~Am_Value((Am_Value *)&head);
        Am_Object::operator=(&obj_1,&local_120);
        Am_Object::~Am_Object(&local_120);
        bVar6 = Am_Object::Valid(&obj_1);
        if (bVar6) {
          if (deferring.code == 0) {
            Am_Object::Am_Object(&local_48,&inter);
            Check_And_Handle_Trace_Next_Inter(&local_48);
            Am_Object::~Am_Object(&local_48);
            pAVar15 = Am_Object::operator_cast_to_Am_Wrapper_(event_window);
            Am_Object::Set(&inter,0x68,pAVar15,0);
            pAVar15 = Am_Object::operator_cast_to_Am_Wrapper_(&obj_1);
            Am_Object::Set(&inter,0x11a,pAVar15,0);
            pAVar15 = Am_Object::operator_cast_to_Am_Wrapper_(&obj_1);
            Am_Object::Set(&inter,0x119,pAVar15,0);
            Am_Input_Char::operator_cast_to_Am_Value(&ev->input_char);
            Am_Object::Set(&inter,0x11b,(Am_Value *)&head,0);
            Am_Value::~Am_Value((Am_Value *)&head);
            Am_Object::Set(&inter,0x11f,ev->x,0);
            Am_Object::Set(&inter,0x120,ev->y,0);
            Am_Object::Set(&inter,0x121,ev->x,0);
            Am_Object::Set(&inter,0x122,ev->y,0);
            pAVar12 = Am_Object::Get(&inter,0xbe,0);
            Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar12);
            pAVar19 = &obj_1;
            goto LAB_001b1056;
          }
          set_inter_deferred(&inter,ev,event_window,&obj_1,deferring);
        }
      }
    }
  }
  else if (AVar11 != Am_INTER_WAITING) {
    pAVar12 = Am_Object::Get(&inter,0xd3,0);
    bVar6 = Am_Value::operator_cast_to_bool(pAVar12);
    if (bVar6) {
      Am_Object::Am_Object(&local_40,&Am_No_Object);
      Am_Beep(&local_40);
      Am_Object::~Am_Object(&local_40);
    }
    pAVar12 = Am_Object::Get(&inter,0xc4,0);
    Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar12);
    (*(code *)0x0)(&inter,&Am_No_Object,event_window,ev);
  }
  Am_Object::~Am_Object(&obj_1);
  bVar9 = bVar4;
  bVar6 = bVar5;
  goto LAB_001b0af2;
}

Assistant:

static void
Interactor_Input_Event_Notify(Am_Object event_window, Am_Input_Event *ev)
{
  //first check if modal window
  if (check_modal_windows(event_window, ev))
    return;

  //now check if a deferred interactor wants this event
  if (check_deferred_events(ev, event_window)) {
    return;
  }

#ifdef DEBUG
  int was_inprogress =
      event_window.Get(Am_OBJECT_IN_PROGRESS, Am_RETURN_ZERO_ON_ERROR);
  if (was_inprogress & 2) {
    std::cerr << "** Processing events for window " << event_window
              << " but crashed last time, so skipping it.\n"
              << std::flush;
    return; //skip this object
  } else
    event_window.Set(Am_OBJECT_IN_PROGRESS, 2, Am_OK_IF_NOT_THERE);
#endif

  Am_Value inter_list_value = event_window.Peek(Am_INTER_LIST);
  Am_Priority_List *inter_list;
  bool wants_event;

  if (inter_list_value.Valid()) {
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_PRIORITIES,
                         "----Interactors for window " << event_window);
    inter_list = Am_Priority_List::Narrow(inter_list_value);
  } else {
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_PRIORITIES,
                         "----NO Interactors for window " << event_window);
    // no interactor list, still have to check global ones so don't exit
    inter_list = nullptr;
  }

  // process all the interactors in inter_list in priority order

  Am_Object inter;
  Am_Value run_also_value;
  Am_Object run_also_object;
  Am_Value_List run_also_list;
  bool doing_RUN_ALSO_only = false; //true if found an inter w/run_also
  bool check_RUN_ALSO_list_or_object = false;
  bool check_RUN_ALSO_object = false;
  bool check_RUN_ALSO_list = false;
  float run_also_priority = 0.0f;
  float this_priority;

  if (inter_list) {
    inter_list->Note_Reference();
    inter_list->Start();
  }
  all_wins_inter_list->Start();

  //std::cout <<"\nGlobal list: " << *all_wins_inter_list << endl
  //  << "List of " << event_window << " = " << *inter_list <<std::endl <<std::flush;

  while (all_wins_inter_list->Two_List_Get_Next(inter_list, inter,
                                                this_priority)) {
    //go through inter_list and all_wins_inter_list in parallel,
    //always getting the next priority inter from each

    // std::cout << "-<.> processing " << inter << " doing_RUN_ALSO_only "
    //      << doing_RUN_ALSO_only << " check_RUN_ALSO_list_or_object "
    //      << check_RUN_ALSO_list_or_object << " run_also_object= "
    //	  << run_also_object << " run_also_list " << run_also_list
    //	  <<std::endl <<std::flush;

    // Sometimes the window gets destroyed and all these interactors are
    // destroyed as well.  Must check to make sure interactors are okay.
    if (!inter.Valid())
      continue;

    if (doing_RUN_ALSO_only &&
        !check_RUN_ALSO_list_or_object) { // then found a regular inter, stop when priority is lower than
      // run_also_priority
      if (this_priority < run_also_priority)
        break; // then done.
    }          // end if (doing_RUN_ALSO_only)

    // std::cout << "__check " << inter << " doing run also=" << doing_RUN_ALSO_only
    //   << " inter runalso=" << (bool)inter.Get(Am_RUN_ALSO) <<std::endl <<std::flush;

    if (check_RUN_ALSO_list)
      run_also_list.Start();

    if ((!doing_RUN_ALSO_only ||
         (check_RUN_ALSO_list_or_object &&
              // if the run_also object is set then inter must be that object
              ((check_RUN_ALSO_object && inter == run_also_object) ||
          // if the run_also list is set then inter must be member of list
          (check_RUN_ALSO_list && run_also_list.Member(inter)))) ||
         //inter itself is a run_also
         (!check_RUN_ALSO_list_or_object && inter.Get(Am_RUN_ALSO).Valid())) &&
        // supports multiple users
        inter_is_go_for_user_and_event(inter, ev)) {
      //--> The actual running of the Interactor is here <--//
      wants_event = Inter_Check_Go(inter, ev, event_window);

      if (wants_event) {
        // Found one to run.  If it is not a RUN_ALSO_only, then only
        // run the RUN_ALSO interactors of the same priority level.
        // If it is a RUN_ALSO, then just keep going.
        // Be sure to fetch Am_RUN_ALSO again after Inter_Check_Go in
        // case changed by the running.
        if (inter.Valid()) {
          //inter might be destroyed while running
          run_also_value = inter.Peek(Am_RUN_ALSO);
          if (!run_also_value.Valid()) {
            //when Am_RUN_ALSO is not valid, then only run other
            // RUN_ALSO interactors.
            doing_RUN_ALSO_only = true;
            run_also_priority = this_priority;
          } else { //valid, see if object or list or ==true
            if (Am_Value_List::Test(run_also_value)) {
              run_also_list = run_also_value;
              doing_RUN_ALSO_only = true;
              run_also_priority = this_priority;
              check_RUN_ALSO_list = true;
              check_RUN_ALSO_list_or_object = true;
            } else if (run_also_value.type == Am_OBJECT) {
              run_also_object = run_also_value;
              doing_RUN_ALSO_only = true;
              run_also_priority = this_priority;
              check_RUN_ALSO_object = true;
              check_RUN_ALSO_list_or_object = true;
            }
            //else must be ==true, so continue to run other
            //interactors (leave doing_RUN_ALSO_only as false)
          }
        } else {
          // inter destroyed while running, but still only run other
          // run_also interactors.
          doing_RUN_ALSO_only = true;
          run_also_priority = this_priority;
        }
      }
    }
  }
  if (inter_list)
    inter_list->Release();
#ifdef DEBUG
  if (event_window.Valid()) //may not be valid while destroying window
    event_window.Set(Am_OBJECT_IN_PROGRESS, 0, Am_OK_IF_NOT_THERE);
#endif
}